

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

void hit_trap(loc grid,wchar_t delayed)

{
  effect *peVar1;
  trap *trap;
  loc lVar2;
  loc lVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  trap *ptVar7;
  trap *ptVar8;
  bool bVar9;
  bool bVar10;
  source sVar11;
  source origin;
  source origin_00;
  _Bool ident;
  wchar_t local_3c;
  loc local_38;
  
  ident = false;
  local_3c = delayed;
  ptVar7 = square_trap(cave,grid);
  lVar3 = grid;
  lVar2 = local_38;
  do {
    while( true ) {
      do {
        trap = ptVar7;
        local_38 = lVar3;
        if (trap == (trap *)0x0) goto LAB_001d3a0e;
        ptVar7 = trap->next;
        _Var4 = flag_has_dbg(trap->kind->flags,3,2,"trap->kind->flags","TRF_TRAP");
        lVar3 = local_38;
        lVar2 = local_38;
      } while (((!_Var4) || (trap->timeout != '\0')) ||
              ((_Var4 = flag_has_dbg(trap->kind->flags,3,0xe,"trap->kind->flags","TRF_DELAY"),
               local_3c != L'\xffffffff' &&
               (lVar3 = local_38, lVar2 = local_38, (uint)_Var4 != local_3c))));
      _Var4 = player_is_trapsafe(player);
      if (!_Var4) break;
      _Var4 = player_of_has(player,L'(');
      if (_Var4) {
        equip_learn_flag(player,L'(');
      }
LAB_001d39cb:
      flag_on_dbg(trap->flags,3,3,"trap->flags","TRF_VISIBLE");
      lVar3 = local_38;
      lVar2 = local_38;
    }
    disturb(player);
    if (trap->kind->msg != (char *)0x0) {
      msg("%s");
    }
    wVar5 = flag_next(trap->kind->save_flags,6,1);
    if (wVar5 == L'\0') {
      bVar9 = false;
      bVar10 = false;
    }
    else {
      bVar9 = false;
      bVar10 = false;
      do {
        _Var4 = player_of_has(player,wVar5);
        if (_Var4) {
          equip_learn_flag(player,wVar5);
          bVar9 = true;
          bVar10 = true;
        }
        wVar5 = flag_next(trap->kind->save_flags,6,wVar5 + L'\x01');
      } while (wVar5 != L'\0');
    }
    _Var4 = flag_has_dbg(trap->kind->flags,3,0xc,"trap->kind->flags","TRF_SAVE_ARMOR");
    if (_Var4) {
      _Var4 = check_hit(player,L'}');
      bVar10 = bVar9;
      if (!_Var4) {
        bVar10 = true;
      }
    }
    _Var4 = flag_has_dbg(trap->kind->flags,3,0xb,"trap->kind->flags","TRF_SAVE_THROW");
    if ((_Var4) && (wVar5 = Rand_div(100), wVar5 < (player->state).skills[3])) {
      bVar10 = true;
    }
    grid = local_38;
    if (bVar10) {
      if (trap->kind->msg_good != (char *)0x0) {
        msg("%s");
      }
    }
    else {
      if (trap->kind->msg_bad != (char *)0x0) {
        msg("%s");
      }
      peVar1 = trap->kind->effect;
      sVar11 = source_trap(trap);
      origin.which = sVar11.which;
      origin._4_4_ = 0;
      origin.what = sVar11.what;
      effect_do(peVar1,origin,(object *)0x0,&ident,false,L'\0',L'\0',L'\0',(command *)0x0);
      ptVar8 = square_trap(cave,grid);
      lVar2 = local_38;
      if ((ptVar8 == (trap *)0x0) || (player->is_dead != false)) {
LAB_001d3a0e:
        local_38 = lVar2;
        square_memorize_traps((chunk *)cave,grid);
        _Var4 = square_isseen(cave,grid);
        if (_Var4) {
          square_light_spot((chunk *)cave,grid);
        }
        return;
      }
      if ((trap->kind->effect_xtra != (effect *)0x0) && (uVar6 = Rand_div(2), uVar6 == 0)) {
        if (trap->kind->msg_xtra != (char *)0x0) {
          msg("%s");
        }
        peVar1 = trap->kind->effect_xtra;
        sVar11 = source_trap(trap);
        origin_00.which = sVar11.which;
        origin_00._4_4_ = 0;
        origin_00.what = sVar11.what;
        effect_do(peVar1,origin_00,(object *)0x0,&ident,false,L'\0',L'\0',L'\0',(command *)0x0);
        ptVar8 = square_trap(cave,grid);
        lVar2 = local_38;
        if ((ptVar8 == (trap *)0x0) || (player->is_dead != false)) goto LAB_001d3a0e;
      }
    }
    _Var4 = flag_has_dbg(trap->kind->flags,3,7,"trap->kind->flags","TRF_DOWN");
    if (_Var4) {
      wVar5 = player_get_next_place((int)player->place,"down",L'\x01');
      player_change_place(player,wVar5);
    }
    _Var4 = flag_has_dbg(trap->kind->flags,3,8,"trap->kind->flags","TRF_PIT");
    if ((_Var4) && (_Var4 = loc_eq(player->grid,(loc_conflict)trap->grid), !_Var4)) {
      lVar2.x = (player->grid).x;
      lVar2.y = (player->grid).y;
      monster_swap(lVar2,trap->grid);
      player_handle_post_move(player,false,true);
    }
    _Var4 = flag_has_dbg(trap->kind->flags,3,9,"trap->kind->flags","TRF_ONETIME");
    if ((!_Var4) && (uVar6 = Rand_div(3), uVar6 != 0)) goto LAB_001d39cb;
    _Var4 = square_remove_trap((chunk *)cave,grid,trap,false);
    lVar3 = local_38;
    lVar2 = local_38;
    if (!_Var4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/trap.c"
                    ,0x270,"void hit_trap(struct loc, int)");
    }
  } while( true );
}

Assistant:

extern void hit_trap(struct loc grid, int delayed)
{
	bool ident = false;
	struct trap *trap, *next_trap;
	struct effect *effect;

	/* Look at the traps in this grid */
	for (trap = square_trap(cave, grid); trap; trap = next_trap) {
		int flag;
		bool saved = false;

		next_trap = trap->next;

		/* Require that trap be capable of affecting the character */
		if (!trf_has(trap->kind->flags, TRF_TRAP)) continue;
		if (trap->timeout) continue;

		if (delayed != trf_has(trap->kind->flags, TRF_DELAY) &&
		    delayed != -1)
			continue;

		if (player_is_trapsafe(player)) {
			/* Trap immune player learns the rune */
			if (player_of_has(player, OF_TRAP_IMMUNE)) {
				equip_learn_flag(player, OF_TRAP_IMMUNE);
			}
			/* Trap becomes visible. */
			trf_on(trap->flags, TRF_VISIBLE);
			continue;
		}

		/* Disturb the player */
		disturb(player);

		/* Give a message */
		if (trap->kind->msg)
			msg("%s", trap->kind->msg);

		/* Test for save due to flag */
		for (flag = of_next(trap->kind->save_flags, FLAG_START);
			 flag != FLAG_END;
			 flag = of_next(trap->kind->save_flags, flag + 1))
			if (player_of_has(player, flag)) {
				saved = true;
				equip_learn_flag(player, flag);
			}

		/* Test for save due to armor */
		if (trf_has(trap->kind->flags, TRF_SAVE_ARMOR)
			&& !check_hit(player, 125))
			saved = true;

		/* Test for save due to saving throw */
		if (trf_has(trap->kind->flags, TRF_SAVE_THROW) &&
			(randint0(100) < player->state.skills[SKILL_SAVE]))
			saved = true;

		/* Save, or fire off the trap */
		if (saved) {
			if (trap->kind->msg_good)
				msg("%s", trap->kind->msg_good);
		} else {
			if (trap->kind->msg_bad)
				msg("%s", trap->kind->msg_bad);
			effect = trap->kind->effect;
			effect_do(effect, source_trap(trap), NULL, &ident, false, 0, 0, 0, NULL);

			/* Trap may have gone or the player may be dead */
			if (!square_trap(cave, grid) || player->is_dead) break;

			/* Do any extra effects */
			if (trap->kind->effect_xtra && one_in_(2)) {
				if (trap->kind->msg_xtra)
					msg("%s", trap->kind->msg_xtra);
				effect = trap->kind->effect_xtra;
				effect_do(effect, source_trap(trap), NULL, &ident, false,
						  0, 0, 0, NULL);

				/* Trap may have gone or the player may be dead */
				if (!square_trap(cave, grid) || player->is_dead) break;
			}
		}

		/* Some traps drop you a dungeon level */
		if (trf_has(trap->kind->flags, TRF_DOWN)) {
			int target_place = player_get_next_place(player->place, "down", 1);
			player_change_place(player,	target_place);
		}

		/* Some traps drop you onto them */
		if (trf_has(trap->kind->flags, TRF_PIT)
				&& !loc_eq(player->grid, trap->grid)) {
			monster_swap(player->grid, trap->grid);
			/*
			 * Don't retrigger the trap, but handle the
			 * other side effects of an involuntary move of the
			 * player.
			 */
			player_handle_post_move(player, false, true);
		}

		/* Some traps disappear after activating, all have a chance to */
		if (trf_has(trap->kind->flags, TRF_ONETIME) || one_in_(3)) {
			if (!square_remove_trap(cave, grid, trap, false)) {
				assert(0);
			}
		} else {
			/* Trap becomes visible */
			trf_on(trap->flags, TRF_VISIBLE);
		}
	}

	/* Update the player's view. */
	square_memorize_traps(cave, grid);
	if (square_isseen(cave, grid)) {
		square_light_spot(cave, grid);
	}
}